

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSocket.cpp
# Opt level: O0

void __thiscall Scs::Socket::~Socket(Socket *this)

{
  Socket *this_local;
  
  if (this->m_socket != -1) {
    shutdown(this->m_socket,1);
    close(this->m_socket);
  }
  std::shared_ptr<Scs::Address>::~shared_ptr(&this->m_address);
  return;
}

Assistant:

Socket::~Socket()
{
	if (m_socket != INVALID_SOCKET)
	{
		shutdown(m_socket, SD_SEND);
#ifdef SCS_WINDOWS
		closesocket(m_socket);
#else
        close(m_socket);
#endif
	}
}